

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half_perf_test.cpp
# Opt level: O2

void perf_test_float_to_half(uint16_t *halfs,float *floats,int numentries)

{
  imath_half_bits_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  int i;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  iVar2 = get_ticks();
  uVar7 = 0;
  uVar9 = 0;
  if (0 < numentries) {
    uVar9 = (ulong)(uint)numentries;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = imath_float_to_half(floats[uVar7]);
    halfs[uVar7] = iVar1;
  }
  iVar3 = get_ticks();
  iVar4 = get_ticks();
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = imath_float_to_half(floats[uVar7]);
    halfs[uVar7] = iVar1;
  }
  iVar5 = get_ticks();
  lVar6 = iVar5 - iVar4;
  lVar8 = iVar3 - iVar2;
  fprintf(_stderr,"float -> half Old: %10lld (%g ns) New: %10lld (%g ns) (%10lld)\n",
          (double)lVar6 / (double)numentries,(double)lVar8 / (double)numentries,lVar6,lVar8,
          lVar6 - lVar8);
  return;
}

Assistant:

void
perf_test_float_to_half (uint16_t* halfs, const float* floats, int numentries)
{
    half* halfvals = reinterpret_cast<half*> (halfs);

    int64_t st = get_ticks ();
    for (int i = 0; i < numentries; ++i)
        halfs[i] = imath_float_to_half (floats[i]);
    int64_t et = get_ticks ();

    int64_t ost = get_ticks ();
    for (int i = 0; i < numentries; ++i)
        halfvals[i] = exptable_half_constructor (floats[i]);
    int64_t oet = get_ticks ();

    int64_t onanos = (oet - ost);
    int64_t nnanos = (et - st);
    fprintf (
        stderr,
        "float -> half Old: %10lld (%g ns) New: %10lld (%g ns) (%10lld)\n",
        (long long) onanos,
        (double) onanos / ((double) numentries),
        (long long) nnanos,
        (double) nnanos / ((double) numentries),
        ((long long) (onanos - nnanos)));
}